

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetainfoSet.cpp
# Opt level: O0

vector<JSONNode,_std::allocator<JSONNode>_> * __thiscall
ser::MetainfoSet::GenerateNodes
          (vector<JSONNode,_std::allocator<JSONNode>_> *__return_storage_ptr__,MetainfoSet *this)

{
  bool bVar1;
  size_type __n;
  pointer ppVar2;
  any local_68 [4];
  undefined1 local_48 [16];
  undefined1 local_38 [8];
  const_iterator iter;
  MetainfoSet *this_local;
  vector<JSONNode,_std::allocator<JSONNode>_> *res;
  
  std::vector<JSONNode,_std::allocator<JSONNode>_>::vector(__return_storage_ptr__);
  __n = std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
        ::size(&this->data_);
  std::vector<JSONNode,_std::allocator<JSONNode>_>::reserve(__return_storage_ptr__,__n);
  local_38 = (undefined1  [8])
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
             ::begin(&this->data_);
  while( true ) {
    local_48._8_8_ =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
         ::end(&this->data_);
    bVar1 = std::operator!=((_Self *)local_38,(_Self *)(local_48 + 8));
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>
                           *)local_38);
    std::__cxx11::string::string((string *)local_68,(string *)ppVar2);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>
                  *)local_38);
    anyNode((string *)local_48,local_68);
    std::vector<JSONNode,_std::allocator<JSONNode>_>::push_back
              (__return_storage_ptr__,(value_type *)local_48);
    ::JSONNode::~JSONNode((JSONNode *)local_48);
    std::__cxx11::string::~string((string *)local_68);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>
                  *)local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector< JSONNode> MetainfoSet::GenerateNodes() const
{
    std::vector< JSONNode> res;
    res.reserve(data_.size());
    for (std::map<std::string, boost::any>::const_iterator iter = data_.begin(); iter != data_.end(); ++iter)
    {
        res.push_back(anyNode(iter->first, iter->second));
    }
    return res;
}